

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

bool nite::isNumber(string *number)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  undefined7 uVar4;
  long lVar5;
  uint i;
  ulong uVar6;
  string local_80;
  string local_60;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  undefined4 local_34;
  
  if ((isNumber(std::__cxx11::string)::numbers_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&isNumber(std::__cxx11::string)::numbers_abi_cxx11_), iVar3 != 0))
  {
    std::__cxx11::string::string
              ((string *)isNumber(std::__cxx11::string)::numbers_abi_cxx11_,"0",
               (allocator *)&local_60);
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 1),"1",
               (allocator *)&local_80);
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 2),"2",&local_3d);
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 3),"3",&local_3c);
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 4),"4",&local_3b);
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 5),"5",&local_3a);
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 6),"6",&local_39);
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 7),"7",&local_38);
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 8),"8",&local_37);
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 9),"9",&local_36);
    std::__cxx11::string::string
              ((string *)(isNumber(std::__cxx11::string)::numbers_abi_cxx11_ + 10),".",&local_35);
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&isNumber(std::__cxx11::string)::numbers_abi_cxx11_);
  }
  strAt(&local_60,number,0);
  bVar1 = std::operator==(&local_60,"+");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    strAt(&local_80,number,0);
    bVar1 = std::operator==(&local_80,"-");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    if (!bVar1) goto LAB_0019776c;
  }
  std::__cxx11::string::erase((ulong)number,0);
LAB_0019776c:
  uVar6 = 0;
  if (number->_M_string_length == 0) {
    local_34 = 0;
  }
  else {
    do {
      uVar4 = (undefined7)(uVar6 >> 8);
      if (number->_M_string_length <= uVar6) {
        local_34 = (undefined4)CONCAT71(uVar4,1);
        break;
      }
      local_34 = (undefined4)CONCAT71(uVar4,number->_M_string_length <= uVar6);
      bVar1 = false;
      for (lVar5 = 0; lVar5 != 0x160; lVar5 = lVar5 + 0x20) {
        strAt(&local_60,number,(uint)uVar6);
        _Var2 = std::operator==(&local_60,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&isNumber(std::__cxx11::string)::numbers_abi_cxx11_[0].
                                         _M_dataplus._M_p + lVar5));
        std::__cxx11::string::~string((string *)&local_60);
        if (_Var2) {
          bVar1 = true;
        }
      }
      uVar6 = (ulong)((uint)uVar6 + 1);
    } while (bVar1);
  }
  return SUB41(local_34,0);
}

Assistant:

bool nite::isNumber(String number){
	static const String numbers[]={
		"0","1","2","3","4","5",
		"6","7","8","9","."
	};
	static const unsigned size = sizeof(numbers)/sizeof(String);

	/* remove signs */
	if (nite::strAt(number,0)=="+" or nite::strAt(number,0)=="-")
		number.erase(0,1);

	if (number.length()==0)
		return 0;
	bool n=0;
	for (unsigned i=0; i<number.length(); i++){
		n=0;
		for (unsigned e=0; e<size; e++){
			if (nite::strAt(number,i)==numbers[e])
				n=1;
		}
		if (n==0)
			return 0;
	}
    return 1;

}